

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * __thiscall
QUtil::hex_encode_char_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,char c)

{
  char c_local;
  
  ::qpdf::util::hex_encode_char_abi_cxx11_
            (__return_storage_ptr__,(util *)(ulong)(uint)(int)(char)this,c);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::hex_encode_char(char c)
{
    return util::hex_encode_char(c);
}